

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.h
# Opt level: O3

void gutil::runParallel(ParallelFunction *fct,long start,long end,long step)

{
  uint uVar1;
  uint uVar2;
  ulong *puVar3;
  Thread *pTVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  Thread *this;
  
  uVar1 = Thread::getMaxThreads();
  uVar2 = (uint)(((end - start) + step) / step);
  if ((int)uVar1 < (int)uVar2) {
    uVar2 = uVar1;
  }
  if (1 < (int)uVar2) {
    uVar6 = (ulong)uVar2;
    puVar3 = (ulong *)operator_new__(uVar6 * 8 + 8);
    *puVar3 = uVar6;
    this = (Thread *)(puVar3 + 1);
    lVar5 = 0;
    pTVar4 = this;
    do {
      Thread::Thread(pTVar4);
      lVar5 = lVar5 + -8;
      pTVar4 = pTVar4 + 1;
    } while (-lVar5 != uVar6 * 8);
    pTVar4 = this;
    uVar7 = uVar6;
    do {
      Thread::create(pTVar4,fct,start,end,uVar6 * step,-1);
      start = start + step;
      pTVar4 = pTVar4 + 1;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
    do {
      Thread::join(this);
      this = this + 1;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
    if (*puVar3 != 0) {
      lVar5 = *puVar3 << 3;
      do {
        Thread::~Thread((Thread *)((long)puVar3 + lVar5));
        lVar5 = lVar5 + -8;
      } while (lVar5 != 0);
    }
    operator_delete__(puVar3);
    return;
  }
  (**fct->_vptr_ParallelFunction)(fct,start,end,step);
  return;
}

Assistant:

inline void runParallel(ParallelFunction &fct, long start, long end, long step)
{
  int n=Thread::getMaxThreads();
  n=std::min(n, static_cast<int>((end-start+1+step-1)/step));

  if (n > 1)
  {
    Thread *thread=new Thread [n];

    for (int i=0; i<n; i++)
    {
      thread[i].create(fct, start+i*step, end, n*step, -1);
    }

    for (int i=0; i<n; i++)
    {
      thread[i].join();
    }

    delete [] thread;
  }
  else
  {
    fct.run(start, end, step);
  }
}